

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gms_matcher.h
# Opt level: O3

void __thiscall
gms_matcher::NormalizePoints
          (gms_matcher *this,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *kp,Size *size,
          vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *npts)

{
  Size SVar1;
  pointer pKVar2;
  pointer pPVar3;
  pointer pKVar4;
  long lVar5;
  size_type __new_size;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int local_38;
  int iStack_34;
  
  pKVar4 = (kp->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pKVar2 = (kp->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = ((long)pKVar4 - (long)pKVar2 >> 2) * 0x6db6db6db6db6db7;
  SVar1 = *size;
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::resize(npts,__new_size);
  if (pKVar4 != pKVar2) {
    pKVar4 = (kp->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pPVar3 = (npts->super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_38 = SVar1.width;
    iStack_34 = SVar1.height;
    lVar5 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)pKVar4;
      auVar7._4_4_ = (float)iStack_34;
      auVar7._0_4_ = (float)local_38;
      auVar7._8_8_ = 0;
      auVar7 = divps(auVar6,auVar7);
      pPVar3[lVar5] = auVar7._0_8_;
      lVar5 = lVar5 + 1;
      pKVar4 = pKVar4 + 0x1c;
    } while (__new_size + (__new_size == 0) != lVar5);
  }
  return;
}

Assistant:

void NormalizePoints(const vector<KeyPoint> &kp, const Size &size, vector<Point2f> &npts) {
		const size_t numP = kp.size();
		const int width   = size.width;
		const int height  = size.height;
		npts.resize(numP);

		for (size_t i = 0; i < numP; i++)
		{
			npts[i].x = kp[i].pt.x / width;
			npts[i].y = kp[i].pt.y / height;
		}
	}